

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memmove_s.c
# Opt level: O0

int memmove_s(void *dst,size_t sizeInBytes,void *src,size_t count)

{
  void *pvVar1;
  void *ret_val;
  size_t count_local;
  void *src_local;
  size_t sizeInBytes_local;
  void *dst_local;
  
  if (count == 0) {
    dst_local._4_4_ = 0;
  }
  else if (dst == (void *)0x0) {
    dst_local._4_4_ = 0x16;
  }
  else if (src == (void *)0x0) {
    dst_local._4_4_ = 0x16;
  }
  else if (sizeInBytes < count) {
    dst_local._4_4_ = 0x22;
  }
  else {
    pvVar1 = memmove_xplat(dst,src,count);
    dst_local._4_4_ = 0xc;
    if (pvVar1 != (void *)0x0) {
      dst_local._4_4_ = 0;
    }
  }
  return dst_local._4_4_;
}

Assistant:

int __cdecl memmove_s(
    void * dst,
    size_t sizeInBytes,
    const void * src,
    size_t count
)
{
    if (count == 0)
    {
        /* nothing to do */
        return 0;
    }

    /* validation section */
    _VALIDATE_RETURN_ERRCODE(dst != NULL, EINVAL);
    _VALIDATE_RETURN_ERRCODE(src != NULL, EINVAL);
    _VALIDATE_RETURN_ERRCODE(sizeInBytes >= count, ERANGE);

    void *ret_val = memmove_xplat(dst, src, count);
    return ret_val != NULL ? 0 : ENOMEM; // memmove_xplat returns `NULL` only if ENOMEM
}